

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O2

void __thiscall btSoftBody::setVolumeDensity(btSoftBody *this,btScalar density)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  bool bVar5;
  float fVar6;
  
  uVar1 = (this->m_tetras).m_size;
  uVar3 = 0;
  uVar2 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar2 = uVar3;
  }
  fVar6 = 0.0;
  for (; uVar3 != uVar2; uVar3 = uVar3 + 1) {
    iVar4 = 4;
    while (bVar5 = iVar4 != 0, iVar4 = iVar4 + -1, bVar5) {
      fVar6 = fVar6 + ABS((this->m_tetras).m_data[uVar3].m_rv);
    }
  }
  setVolumeMass(this,(fVar6 * density) / 6.0);
  return;
}

Assistant:

void			btSoftBody::setVolumeDensity(btScalar density)
{
btScalar	volume=0;
for(int i=0;i<m_tetras.size();++i)
	{
	const Tetra& t=m_tetras[i];
	for(int j=0;j<4;++j)
		{
		volume+=btFabs(t.m_rv);
		}
	}
setVolumeMass(volume*density/6);
}